

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int pager_release_page(Pager *pPager,Page *pPage)

{
  int local_1c;
  int rc;
  Page *pPage_local;
  Pager *pPager_local;
  
  local_1c = 0;
  if ((pPage->flags & 2U) == 0) {
    if ((pPager->xPageUnpin != (_func_void_void_ptr *)0x0) && (pPage->pUserData != (void *)0x0)) {
      (*pPager->xPageUnpin)(pPage->pUserData);
    }
    pPage->pUserData = (void *)0x0;
    SyMemBackendPoolFree(pPager->pAllocator,pPage);
  }
  else {
    local_1c = -4;
  }
  return local_1c;
}

Assistant:

static int pager_release_page(Pager *pPager,Page *pPage)
{
	int rc = UNQLITE_OK;
	if( !(pPage->flags & PAGE_DIRTY)){
		/* Invoke the unpin callback if available */
		if( pPager->xPageUnpin && pPage->pUserData ){
			pPager->xPageUnpin(pPage->pUserData);
		}
		pPage->pUserData = 0;
		SyMemBackendPoolFree(pPager->pAllocator,pPage);
	}else{
		/* Dirty page, it will be released later when a dirty commit
		 * or the final commit have been applied.
		 */
		rc = UNQLITE_LOCKED;
	}
	return rc;
}